

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int cvDoProjection(CVodeMem cv_mem,int *nflagPtr,realtype saved_t,int *npfailPtr)

{
  CVodeProjMem pCVar1;
  N_Vector p_Var2;
  realtype rVar3;
  int *in_RDX;
  undefined4 *in_RSI;
  CVodeMem in_RDI;
  CVodeProjMem proj_mem;
  N_Vector acorP;
  N_Vector errP;
  int retval;
  N_Vector in_stack_ffffffffffffffa8;
  CVodeMem in_stack_ffffffffffffffb0;
  CVodeMem cv_mem_00;
  N_Vector local_38;
  int local_2c;
  int local_4;
  
  if (in_RDI->proj_mem == (CVodeProjMem)0x0) {
    cvProcessError(in_RDI,-0x1d,"CVODE","cvDoProjection","proj_mem = NULL illegal.");
    local_4 = -0x1d;
  }
  else {
    pCVar1 = in_RDI->proj_mem;
    p_Var2 = in_RDI->cv_tempv;
    if (pCVar1->err_proj == 0) {
      local_38 = (N_Vector)0x0;
    }
    else {
      local_38 = in_RDI->cv_ftemp;
    }
    if (pCVar1->err_proj != 0) {
      N_VScale((realtype)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(N_Vector)0x119dc05);
    }
    local_2c = (*pCVar1->pfun)(in_RDI->cv_tn,in_RDI->cv_y,p_Var2,pCVar1->eps_proj,local_38,
                               in_RDI->cv_user_data);
    pCVar1->nproj = pCVar1->nproj + 1;
    pCVar1->first_proj = 0;
    if (local_2c == 0) {
      if (pCVar1->err_proj != 0) {
        rVar3 = N_VWrmsNorm((N_Vector)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        in_RDI->cv_acnrm = rVar3;
      }
      in_RDI->proj_applied = 1;
      local_4 = 0;
    }
    else {
      if (local_2c < 0) {
        local_2c = -0x1e;
      }
      if (0 < local_2c) {
        local_2c = 0xd;
      }
      pCVar1->npfails = pCVar1->npfails + 1;
      cvRestore(in_stack_ffffffffffffffb0,(realtype)in_stack_ffffffffffffffa8);
      if (local_2c == -0x1e) {
        local_4 = -0x1e;
      }
      else {
        *in_RDX = *in_RDX + 1;
        in_RDI->cv_etamax = 1.0;
        if (((in_RDI->cv_hmin * 1.000001 < ABS(in_RDI->cv_h)) && (*in_RDX != pCVar1->max_fails)) ||
           (local_2c != 0xd)) {
          if (pCVar1->eta_pfail <= in_RDI->cv_hmin / ABS(in_RDI->cv_h)) {
            cv_mem_00 = (CVodeMem)(in_RDI->cv_hmin / ABS(in_RDI->cv_h));
          }
          else {
            cv_mem_00 = (CVodeMem)pCVar1->eta_pfail;
          }
          in_RDI->cv_eta = (realtype)cv_mem_00;
          *in_RSI = 8;
          cvRescale(cv_mem_00);
          local_4 = 3;
        }
        else {
          local_4 = -0x1f;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int cvDoProjection(CVodeMem cv_mem, int *nflagPtr, realtype saved_t,
                   int *npfailPtr)
{
  int          retval;
  N_Vector     errP;
  N_Vector     acorP;
  CVodeProjMem proj_mem;

  /* Access projection memory */
  if (cv_mem->proj_mem == NULL) {
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, "CVODE",
                   "cvDoProjection", MSG_CV_PROJ_MEM_NULL);
    return(CV_PROJ_MEM_NULL);
  }
  proj_mem = cv_mem->proj_mem;

  /* Initialize return flag to success */
  retval = CV_SUCCESS;

  /* Use tempv to store acorP and, if projecting the error, ftemp to store
     errP (recall that in this case we did not allocate vectors to for
     acorP and errP). */
  acorP = cv_mem->cv_tempv;
  if (proj_mem->err_proj)
    errP = cv_mem->cv_ftemp;
  else
    errP = NULL;

  /* Copy acor into errP (if projecting the error) */
  if (proj_mem->err_proj) N_VScale(ONE, cv_mem->cv_acor, errP);

  /* Call the user projection function */
  retval = proj_mem->pfun(cv_mem->cv_tn, cv_mem->cv_y, acorP,
                          proj_mem->eps_proj, errP, cv_mem->cv_user_data);
  proj_mem->nproj++;

  /* This is not the first projection anymore */
  proj_mem->first_proj = SUNFALSE;

  /* Check the return value */
  if (retval == CV_SUCCESS)
  {
    /* Recompute acnrm to be used in error test (if projecting the error) */
    if (proj_mem->err_proj)
      cv_mem->cv_acnrm = N_VWrmsNorm(errP, cv_mem->cv_ewt);

    /* The projection was successful, return now */
    cv_mem->proj_applied = SUNTRUE;
    return(CV_SUCCESS);
  }

  /* The projection failed, update the return value */
  if (retval < 0) retval = CV_PROJFUNC_FAIL;
  if (retval > 0) retval = PROJFUNC_RECVR;

  /* Increment cumulative failure count and restore zn */
  proj_mem->npfails++;
  cvRestore(cv_mem, saved_t);

  /* Return if failed unrecoverably */
  if (retval == CV_PROJFUNC_FAIL) return(CV_PROJFUNC_FAIL);

  /* Recoverable failure, increment failure count for this step attempt */
  (*npfailPtr)++;
  cv_mem->cv_etamax = ONE;

  /* Check for maximum number of failures or |h| = hmin */
  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*npfailPtr == proj_mem->max_fails))
  {
    if (retval == PROJFUNC_RECVR) return(CV_REPTD_PROJFUNC_ERR);
  }

  /* Reduce step size; return to reattempt the step */
  cv_mem->cv_eta = SUNMAX(proj_mem->eta_pfail,
                          cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  *nflagPtr = PREV_PROJ_FAIL;
  cvRescale(cv_mem);

  return(PREDICT_AGAIN);
}